

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_3cf1::TestCheckCloseFailsOnException::~TestCheckCloseFailsOnException
          (TestCheckCloseFailsOnException *this)

{
  TestCheckCloseFailsOnException *this_local;
  
  ~TestCheckCloseFailsOnException(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckCloseFailsOnException)
{
    bool failure = false;
    {
        RecordingReporter reporter;
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK_CLOSE ((float)ThrowingFunction(), 1.0001f, 0.1f);
        failure = (testResults.GetFailureCount() > 0);
    }

    CHECK(failure);
}